

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<QSslErrorEntry>::emplace<QSslErrorEntry>
          (QPodArrayOps<QSslErrorEntry> *this,qsizetype i,QSslErrorEntry *args)

{
  long lVar1;
  QSslErrorEntry QVar2;
  bool bVar3;
  qsizetype qVar4;
  QSslErrorEntry *pQVar5;
  QSslErrorEntry *in_RDX;
  QArrayDataPointer<QSslErrorEntry> *in_RSI;
  QArrayDataPointer<QSslErrorEntry> *in_RDI;
  long in_FS_OFFSET;
  QSslErrorEntry *where;
  GrowthPosition pos;
  bool detach;
  QSslErrorEntry tmp;
  QArrayDataPointer<QSslErrorEntry> *in_stack_ffffffffffffffc8;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 uVar7;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = QArrayDataPointer<QSslErrorEntry>::needsDetach(in_RDI);
  uVar7 = CONCAT13(bVar3,(int3)in_stack_ffffffffffffffd4);
  if (!bVar3) {
    if ((in_RSI == (QArrayDataPointer<QSslErrorEntry> *)in_RDI->size) &&
       (qVar4 = QArrayDataPointer<QSslErrorEntry>::freeSpaceAtEnd(in_stack_ffffffffffffffc8),
       qVar4 != 0)) {
      pQVar5 = QArrayDataPointer<QSslErrorEntry>::end(in_RDI);
      *pQVar5 = *in_RDX;
      in_RDI->size = in_RDI->size + 1;
      goto LAB_001441aa;
    }
    if ((in_RSI == (QArrayDataPointer<QSslErrorEntry> *)0x0) &&
       (qVar4 = QArrayDataPointer<QSslErrorEntry>::freeSpaceAtBegin(in_stack_ffffffffffffffc8),
       qVar4 != 0)) {
      pQVar5 = QArrayDataPointer<QSslErrorEntry>::begin
                         ((QArrayDataPointer<QSslErrorEntry> *)0x1440f5);
      pQVar5[-1] = *in_RDX;
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      goto LAB_001441aa;
    }
  }
  QVar2 = *in_RDX;
  uVar6 = 0;
  if ((in_RDI->size != 0) && (in_RSI == (QArrayDataPointer<QSslErrorEntry> *)0x0)) {
    uVar6 = 1;
  }
  QArrayDataPointer<QSslErrorEntry>::detachAndGrow
            (in_RSI,(GrowthPosition)((ulong)in_RDX >> 0x20),CONCAT44(uVar7,uVar6),
             (QSslErrorEntry **)in_stack_ffffffffffffffc8,in_RDI);
  pQVar5 = createHole((QPodArrayOps<QSslErrorEntry> *)in_RSI,(GrowthPosition)((ulong)in_RDX >> 0x20)
                      ,CONCAT44(uVar7,uVar6),(qsizetype)in_stack_ffffffffffffffc8);
  *pQVar5 = QVar2;
LAB_001441aa:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }